

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O0

DdNode * cuddZddIntersect(DdManager *zdd,DdNode *P,DdNode *Q)

{
  DdNode *pDVar1;
  DdNode *E;
  DdManager *table;
  DdNode *res;
  DdNode *e;
  DdNode *t;
  DdNode *empty;
  int q_top;
  int p_top;
  DdNode *Q_local;
  DdNode *P_local;
  DdManager *zdd_local;
  
  pDVar1 = zdd->zero;
  if (P == pDVar1) {
    return pDVar1;
  }
  if (Q == pDVar1) {
    return pDVar1;
  }
  if (P == Q) {
    return P;
  }
  pDVar1 = cuddCacheLookup2Zdd(zdd,cuddZddIntersect,P,Q);
  if (pDVar1 == (DdNode *)0x0) {
    if (P->index == 0x7fffffff) {
      empty._4_4_ = P->index;
    }
    else {
      empty._4_4_ = zdd->permZ[P->index];
    }
    if (Q->index == 0x7fffffff) {
      empty._0_4_ = Q->index;
    }
    else {
      empty._0_4_ = zdd->permZ[Q->index];
    }
    if ((int)empty._4_4_ < (int)(DdHalfWord)empty) {
      table = (DdManager *)cuddZddIntersect(zdd,(P->type).kids.E,Q);
      if (table == (DdManager *)0x0) {
        return (DdNode *)0x0;
      }
    }
    else if ((int)(DdHalfWord)empty < (int)empty._4_4_) {
      table = (DdManager *)cuddZddIntersect(zdd,P,(Q->type).kids.E);
      if (table == (DdManager *)0x0) {
        return (DdNode *)0x0;
      }
    }
    else {
      pDVar1 = cuddZddIntersect(zdd,(P->type).kids.T,(Q->type).kids.T);
      if (pDVar1 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
      E = cuddZddIntersect(zdd,(P->type).kids.E,(Q->type).kids.E);
      if (E == (DdNode *)0x0) {
        Cudd_RecursiveDerefZdd(zdd,pDVar1);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
      table = (DdManager *)cuddZddGetNode(zdd,P->index,pDVar1,E);
      if (table == (DdManager *)0x0) {
        Cudd_RecursiveDerefZdd(zdd,pDVar1);
        Cudd_RecursiveDerefZdd(zdd,E);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
      *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + -1;
    }
    cuddCacheInsert2(zdd,cuddZddIntersect,P,Q,&table->sentinel);
    return &table->sentinel;
  }
  return pDVar1;
}

Assistant:

DdNode *
cuddZddIntersect(
  DdManager * zdd,
  DdNode * P,
  DdNode * Q)
{
    int         p_top, q_top;
    DdNode      *empty = DD_ZERO(zdd), *t, *e, *res;
    DdManager   *table = zdd;

    statLine(zdd);
    if (P == empty)
        return(empty);
    if (Q == empty)
        return(empty);
    if (P == Q)
        return(P);

    /* Check cache. */
    res = cuddCacheLookup2Zdd(table, cuddZddIntersect, P, Q);
    if (res != NULL)
        return(res);

    if (cuddIsConstant(P))
        p_top = P->index;
    else
        p_top = zdd->permZ[P->index];
    if (cuddIsConstant(Q))
        q_top = Q->index;
    else
        q_top = zdd->permZ[Q->index];
    if (p_top < q_top) {
        res = cuddZddIntersect(zdd, cuddE(P), Q);
        if (res == NULL) return(NULL);
    } else if (p_top > q_top) {
        res = cuddZddIntersect(zdd, P, cuddE(Q));
        if (res == NULL) return(NULL);
    } else {
        t = cuddZddIntersect(zdd, cuddT(P), cuddT(Q));
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = cuddZddIntersect(zdd, cuddE(P), cuddE(Q));
        if (e == NULL) {
            Cudd_RecursiveDerefZdd(table, t);
            return(NULL);
        }
        cuddRef(e);
        res = cuddZddGetNode(zdd, P->index, t, e);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(table, t);
            Cudd_RecursiveDerefZdd(table, e);
            return(NULL);
        }
        cuddDeref(t);
        cuddDeref(e);
    }

    cuddCacheInsert2(table, cuddZddIntersect, P, Q, res);

    return(res);

}